

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

void __thiscall
google::protobuf::DescriptorBuilder::BuildEnum
          (DescriptorBuilder *this,EnumDescriptorProto *proto,Descriptor *parent,
          EnumDescriptor *result,FlatAllocator *alloc)

{
  RepeatedPtrField<google::protobuf::EnumDescriptorProto_EnumReservedRange> *this_00;
  void **ppvVar1;
  RepeatedPtrField<google::protobuf::EnumValueDescriptorProto> *this_01;
  VoidPtr VVar2;
  byte bVar3;
  int iVar4;
  PointerT<char> pcVar5;
  ushort *puVar6;
  FeatureSet *key_00;
  pointer pcVar7;
  size_type sVar8;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error_00;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error_01;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error_02;
  undefined8 *puVar9;
  DescriptorNames DVar10;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::EnumValueDescriptorProto>_>
  *pVVar11;
  EnumValueDescriptor *pEVar12;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::EnumDescriptorProto_EnumReservedRange>_>
  *pVVar13;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **ppbVar14;
  Value<google::protobuf::internal::GenericTypeHandler<std::string>_> *in;
  string *psVar15;
  AllocatedData AVar16;
  Rep *pRVar17;
  undefined8 extraout_RAX;
  uint index;
  uint index_00;
  char *pcVar18;
  long lVar19;
  int iVar20;
  EnumDescriptorProto *pEVar21;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pRVar22;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key;
  ulong uVar23;
  long lVar24;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_02;
  iterator iVar25;
  string_view scope;
  string_view name;
  string_view element_name;
  string_view full_name;
  string_view element_name_00;
  string_view element_name_01;
  string_view element_name_02;
  string_view element_name_03;
  string_view proto_name;
  string_view full_name_00;
  string_view option_name;
  string_view name_00;
  EnumValueDescriptor *value;
  undefined1 local_c8 [32];
  undefined1 local_a8 [80];
  code *pcStack_58;
  undefined8 local_50;
  code *pcStack_48;
  undefined8 local_40;
  code *pcStack_38;
  
  if (parent == (Descriptor *)0x0) {
    psVar15 = this->file_->package_;
    pcVar18 = (psVar15->_M_dataplus)._M_p;
    uVar23 = psVar15->_M_string_length;
  }
  else {
    pcVar18 = (parent->all_names_).payload_;
    uVar23 = (ulong)*(ushort *)(pcVar18 + 2);
    pcVar18 = pcVar18 + ~uVar23;
  }
  puVar9 = (undefined8 *)
           ((ulong)(proto->field_0)._impl_.name_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
  scope._M_str = pcVar18;
  scope._M_len = uVar23;
  proto_name._M_str = (char *)*puVar9;
  proto_name._M_len = puVar9[1];
  DVar10 = AllocateNameStrings(this,scope,proto_name,&proto->super_Message,alloc);
  (result->all_names_).payload_ = DVar10.payload_;
  puVar9 = (undefined8 *)
           ((ulong)(proto->field_0)._impl_.name_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
  full_name_00._M_len = (ulong)*(ushort *)(DVar10.payload_ + 2);
  full_name_00._M_str = DVar10.payload_ + ~full_name_00._M_len;
  name._M_str = (char *)*puVar9;
  name._M_len = puVar9[1];
  ValidateSymbolName(this,name,full_name_00,&proto->super_Message);
  result->file_ = this->file_;
  result->containing_type_ = parent;
  bVar3 = result->field_0x1;
  result->field_0x1 = bVar3 & 0xfc;
  result->field_0x1 = bVar3 & 0xf0 | (*(byte *)((long)&proto->field_0 + 0x60) & 3) << 2;
  iVar20 = *(int *)((long)&proto->field_0 + 0x10);
  local_c8._16_8_ = parent;
  if (iVar20 == 0) {
    pcVar18 = (result->all_names_).payload_;
    element_name._M_len = (ulong)*(ushort *)(pcVar18 + 2);
    element_name._M_str = pcVar18 + ~element_name._M_len;
    AddError(this,element_name,&proto->super_Message,NAME,"Enums must contain at least one value.");
    iVar20 = *(int *)((long)&proto->field_0 + 0x10);
  }
  this_01 = &(proto->field_0)._impl_.value_;
  if (0 < iVar20) {
    uVar23 = 0;
    while( true ) {
      pVVar11 = internal::RepeatedPtrFieldBase::
                Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::EnumValueDescriptorProto>>
                          (&this_01->super_RepeatedPtrFieldBase,(int)uVar23);
      iVar20 = (pVVar11->field_0)._impl_.number_;
      pVVar11 = internal::RepeatedPtrFieldBase::
                Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::EnumValueDescriptorProto>>
                          (&this_01->super_RepeatedPtrFieldBase,0);
      if ((long)(pVVar11->field_0)._impl_.number_ + uVar23 != (long)iVar20) break;
      result->sequential_value_limit_ = (int16_t)uVar23;
      iVar20 = *(int *)((long)&proto->field_0 + 0x10);
      if ((0xfffd < uVar23) || (uVar23 = uVar23 + 1, (long)iVar20 <= (long)uVar23))
      goto LAB_0039d451;
    }
    iVar20 = *(int *)((long)&proto->field_0 + 0x10);
  }
LAB_0039d451:
  result->value_count_ = iVar20;
  local_c8._24_8_ = this_01;
  pEVar12 = anon_unknown_24::
            FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
            ::AllocateArray<google::protobuf::EnumValueDescriptor>
                      (&alloc->
                        super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                       ,iVar20);
  result->values_ = pEVar12;
  if (0 < *(int *)((long)&proto->field_0 + 0x10)) {
    lVar19 = 0;
    lVar24 = 0;
    do {
      pVVar11 = internal::RepeatedPtrFieldBase::
                Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::EnumValueDescriptorProto>>
                          ((RepeatedPtrFieldBase *)local_c8._24_8_,(int)lVar24);
      BuildEnumValue(this,pVVar11,result,
                     (EnumValueDescriptor *)(&result->values_->super_SymbolBaseN<0> + lVar19),alloc)
      ;
      lVar24 = lVar24 + 1;
      lVar19 = lVar19 + 0x30;
    } while (lVar24 < *(int *)((long)&proto->field_0 + 0x10));
  }
  iVar20 = *(int *)((long)&proto->field_0 + 0x28);
  result->reserved_range_count_ = iVar20;
  pcVar5 = (alloc->
           super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
           ).pointers_.payload_.super_Base<char>.value;
  if (pcVar5 == (PointerT<char>)0x0) {
    BuildEnum((DescriptorBuilder *)local_a8);
  }
  else {
    iVar4 = (alloc->
            super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
            ).used_.payload_.super_Base<char>.value;
    iVar20 = iVar4 + iVar20 * 8;
    (alloc->
    super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
    ).used_.payload_.super_Base<char>.value = iVar20;
    if (iVar20 <= (alloc->
                  super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                  ).total_.payload_.super_Base<char>.value) {
      result->reserved_ranges_ = (ReservedRange *)(pcVar5 + iVar4);
      if (0 < *(int *)((long)&proto->field_0 + 0x28)) {
        lVar19 = 0;
        lVar24 = 0;
        pEVar21 = proto;
        do {
          pVVar13 = internal::RepeatedPtrFieldBase::
                    Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::EnumDescriptorProto_EnumReservedRange>>
                              (&(proto->field_0)._impl_.reserved_range_.super_RepeatedPtrFieldBase,
                               (int)lVar24);
          BuildReservedRange(this,pVVar13,result,
                             (ReservedRange *)((long)&result->reserved_ranges_->start + lVar19),
                             (FlatAllocator *)pEVar21);
          lVar24 = lVar24 + 1;
          lVar19 = lVar19 + 8;
        } while (lVar24 < *(int *)((long)&proto->field_0 + 0x28));
      }
      iVar20 = *(int *)((long)&proto->field_0 + 0x40);
      result->reserved_name_count_ = iVar20;
      ppbVar14 = protobuf::(anonymous_namespace)::
                 FlatAllocatorImpl<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
                 ::AllocateArray<std::__cxx11::string_const*>
                           ((FlatAllocatorImpl<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
                             *)alloc,iVar20);
      result->reserved_names_ = ppbVar14;
      if (0 < (long)iVar20) {
        lVar19 = 0;
        do {
          in = internal::RepeatedPtrFieldBase::
               Get<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
                         (&(proto->field_0)._impl_.reserved_name_.super_RepeatedPtrFieldBase,
                          (int)lVar19);
          psVar15 = protobuf::(anonymous_namespace)::
                    FlatAllocatorImpl<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
                    ::AllocateStrings<std::__cxx11::string_const&>
                              ((FlatAllocatorImpl<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
                                *)alloc,in);
          result->reserved_names_[lVar19] = psVar15;
          lVar19 = lVar19 + 1;
        } while (iVar20 != lVar19);
      }
      option_name._M_str = "google.protobuf.EnumOptions";
      option_name._M_len = 0x1b;
      AllocateOptions<google::protobuf::EnumDescriptor>(this,proto,result,3,option_name,alloc);
      puVar6 = (ushort *)(result->all_names_).payload_;
      full_name._M_len = (ulong)puVar6[1];
      full_name._M_str = (char *)((long)puVar6 + ~full_name._M_len);
      name_00._M_len = (ulong)*puVar6;
      name_00._M_str = (char *)((long)puVar6 + ~name_00._M_len);
      (result->super_SymbolBase).symbol_type_ = '\x04';
      AddSymbol(this,full_name,(void *)local_c8._16_8_,name_00,&proto->super_Message,(Symbol)result)
      ;
      if (0 < *(int *)((long)&proto->field_0 + 0x28)) {
        this_00 = &(proto->field_0)._impl_.reserved_range_;
        index = 0;
        do {
          psVar15 = (string *)
                    internal::RepeatedPtrFieldBase::
                    Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::EnumDescriptorProto_EnumReservedRange>>
                              (&this_00->super_RepeatedPtrFieldBase,index);
          index_00 = index + 1;
          iVar20 = *(int *)((long)&proto->field_0 + 0x28);
          local_c8._12_4_ = index_00;
          local_c8._16_8_ = (Descriptor *)(ulong)index;
          if ((int)index_00 < iVar20) {
            do {
              AVar16.flat = (KeyValue *)
                            internal::RepeatedPtrFieldBase::
                            Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::EnumDescriptorProto_EnumReservedRange>>
                                      (&this_00->super_RepeatedPtrFieldBase,index_00);
              if ((*(int *)&((AVar16.flat)->second).descriptor <=
                   *(int32_t *)((long)&psVar15->field_2 + 0xc)) &&
                 (*(int32_t *)((long)&psVar15->field_2 + 8) <=
                  *(int *)((long)&((AVar16.flat)->second).descriptor + 4))) {
                pcVar18 = (result->all_names_).payload_;
                uVar23 = (ulong)*(ushort *)(pcVar18 + 2);
                pVVar13 = internal::RepeatedPtrFieldBase::
                          Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::EnumDescriptorProto_EnumReservedRange>>
                                    (&this_00->super_RepeatedPtrFieldBase,(int)local_c8._16_8_);
                pcStack_38 = absl::lts_20250127::functional_internal::
                             InvokeObject<google::protobuf::DescriptorBuilder::BuildEnum(google::protobuf::EnumDescriptorProto_const&,google::protobuf::Descriptor_const*,google::protobuf::EnumDescriptor*,google::protobuf::internal::FlatAllocator&)::__0,std::__cxx11::string>
                ;
                local_40 = local_a8;
                make_error.invoker_ =
                     absl::lts_20250127::functional_internal::
                     InvokeObject<google::protobuf::DescriptorBuilder::BuildEnum(google::protobuf::EnumDescriptorProto_const&,google::protobuf::Descriptor_const*,google::protobuf::EnumDescriptor*,google::protobuf::internal::FlatAllocator&)::__0,std::__cxx11::string>
                ;
                make_error.ptr_.obj = (void *)local_40;
                element_name_00._M_str = pcVar18 + ~uVar23;
                element_name_00._M_len = uVar23;
                local_a8._0_8_ = AVar16.flat;
                local_a8._8_8_ = psVar15;
                AddError(this,element_name_00,&pVVar13->super_Message,NUMBER,make_error);
              }
              index_00 = index_00 + 1;
              iVar20 = *(int *)((long)&proto->field_0 + 0x28);
            } while ((int)index_00 < iVar20);
          }
          index = local_c8._12_4_;
        } while ((int)local_c8._12_4_ < iVar20);
      }
      local_a8._0_8_ = (AllocatedData)0x1;
      local_a8._8_8_ = (string *)0x0;
      this_02 = &(proto->field_0)._impl_.reserved_name_;
      pRVar22 = this_02;
      if ((*(byte *)((long)&proto->field_0 + 0x38) & 1) != 0) {
        pRVar17 = internal::RepeatedPtrFieldBase::rep(&this_02->super_RepeatedPtrFieldBase);
        pRVar22 = (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)pRVar17->elements;
        if (((ulong)(this_02->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ & 1) != 0) {
          pRVar17 = internal::RepeatedPtrFieldBase::rep(&this_02->super_RepeatedPtrFieldBase);
          this_02 = (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)pRVar17->elements;
        }
      }
      ppvVar1 = &(this_02->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ +
                *(int *)((long)&proto->field_0 + 0x40);
      if (pRVar22 !=
          (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)ppvVar1) {
        VVar2.obj = local_a8 + 0x20;
        do {
          key_00 = (FeatureSet *)(pRVar22->super_RepeatedPtrFieldBase).tagged_rep_or_elem_;
          local_c8._0_8_ = (EnumValueDescriptor *)local_a8;
          absl::lts_20250127::container_internal::
          raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,std::char_traits<char>>>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
          ::EmplaceDecomposable::operator()
                    ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>::iterator,_bool>
                      *)VVar2.obj,local_c8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)key_00,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)key_00);
          if (local_a8[0x30] == '\0') {
            pcStack_48 = absl::lts_20250127::functional_internal::
                         InvokeObject<google::protobuf::DescriptorBuilder::BuildEnum(google::protobuf::EnumDescriptorProto_const&,google::protobuf::Descriptor_const*,google::protobuf::EnumDescriptor*,google::protobuf::internal::FlatAllocator&)::__1,std::__cxx11::string>
            ;
            make_error_00.invoker_ =
                 absl::lts_20250127::functional_internal::
                 InvokeObject<google::protobuf::DescriptorBuilder::BuildEnum(google::protobuf::EnumDescriptorProto_const&,google::protobuf::Descriptor_const*,google::protobuf::EnumDescriptor*,google::protobuf::internal::FlatAllocator&)::__1,std::__cxx11::string>
            ;
            make_error_00.ptr_.obj = VVar2.obj;
            element_name_01._M_str =
                 (char *)(key_00->super_Message).super_MessageLite._vptr_MessageLite;
            element_name_01._M_len =
                 (key_00->super_Message).super_MessageLite._internal_metadata_.ptr_;
            local_a8._32_8_ = key_00;
            local_50 = VVar2.obj;
            AddError(this,element_name_01,&proto->super_Message,NAME,make_error_00);
          }
          pRVar22 = (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&(pRVar22->super_RepeatedPtrFieldBase).current_size_;
        } while (pRVar22 !=
                 (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)ppvVar1);
      }
      if (0 < result->value_count_) {
        lVar19 = 0;
        VVar2.obj = local_a8 + 0x20;
        do {
          local_c8._0_8_ = result->values_ + lVar19;
          iVar20 = result->reserved_range_count_;
          if (0 < iVar20) {
            lVar24 = 0;
            do {
              if ((result->reserved_ranges_[lVar24].start <= *(int *)(local_c8._0_8_ + 4)) &&
                 (*(int *)(local_c8._0_8_ + 4) <= result->reserved_ranges_[lVar24].end)) {
                pcVar7 = (*(string **)(local_c8._0_8_ + 8))[1]._M_dataplus._M_p;
                sVar8 = (*(string **)(local_c8._0_8_ + 8))[1]._M_string_length;
                pVVar13 = internal::RepeatedPtrFieldBase::
                          Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::EnumDescriptorProto_EnumReservedRange>>
                                    (&(proto->field_0)._impl_.reserved_range_.
                                      super_RepeatedPtrFieldBase,(int)lVar24);
                pcStack_58 = absl::lts_20250127::functional_internal::
                             InvokeObject<google::protobuf::DescriptorBuilder::BuildEnum(google::protobuf::EnumDescriptorProto_const&,google::protobuf::Descriptor_const*,google::protobuf::EnumDescriptor*,google::protobuf::internal::FlatAllocator&)::__2,std::__cxx11::string>
                ;
                make_error_01.invoker_ =
                     absl::lts_20250127::functional_internal::
                     InvokeObject<google::protobuf::DescriptorBuilder::BuildEnum(google::protobuf::EnumDescriptorProto_const&,google::protobuf::Descriptor_const*,google::protobuf::EnumDescriptor*,google::protobuf::internal::FlatAllocator&)::__2,std::__cxx11::string>
                ;
                make_error_01.ptr_.obj = VVar2.obj;
                element_name_02._M_str = pcVar7;
                element_name_02._M_len = sVar8;
                local_a8._32_8_ = (FeatureSet *)local_c8;
                local_a8._72_8_ = VVar2.obj;
                AddError(this,element_name_02,&pVVar13->super_Message,NUMBER,make_error_01);
                iVar20 = result->reserved_range_count_;
              }
              lVar24 = lVar24 + 1;
            } while (lVar24 < iVar20);
          }
          local_a8._40_8_ = ((*(string **)(local_c8._0_8_ + 8))->_M_dataplus)._M_p;
          local_a8._32_8_ = (*(string **)(local_c8._0_8_ + 8))->_M_string_length;
          iVar25 = absl::lts_20250127::container_internal::
                   raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,std::char_traits<char>>>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                   ::find<std::basic_string_view<char,std::char_traits<char>>>
                             ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,std::char_traits<char>>>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                               *)local_a8,(key_arg<std::basic_string_view<char>_> *)VVar2.obj);
          absl::lts_20250127::container_internal::
          raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
          ::AssertNotDebugCapacity
                    ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                      *)local_a8);
          if (iVar25.ctrl_ != (ctrl_t *)0x0) {
            pcVar7 = (*(string **)(local_c8._0_8_ + 8))[1]._M_dataplus._M_p;
            sVar8 = (*(string **)(local_c8._0_8_ + 8))[1]._M_string_length;
            pVVar11 = internal::RepeatedPtrFieldBase::
                      Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::EnumValueDescriptorProto>>
                                ((RepeatedPtrFieldBase *)local_c8._24_8_,(int)lVar19);
            local_a8._64_8_ =
                 absl::lts_20250127::functional_internal::
                 InvokeObject<google::protobuf::DescriptorBuilder::BuildEnum(google::protobuf::EnumDescriptorProto_const&,google::protobuf::Descriptor_const*,google::protobuf::EnumDescriptor*,google::protobuf::internal::FlatAllocator&)::__3,std::__cxx11::string>
            ;
            make_error_02.invoker_ =
                 absl::lts_20250127::functional_internal::
                 InvokeObject<google::protobuf::DescriptorBuilder::BuildEnum(google::protobuf::EnumDescriptorProto_const&,google::protobuf::Descriptor_const*,google::protobuf::EnumDescriptor*,google::protobuf::internal::FlatAllocator&)::__3,std::__cxx11::string>
            ;
            make_error_02.ptr_.obj = VVar2.obj;
            element_name_03._M_str = pcVar7;
            element_name_03._M_len = sVar8;
            local_a8._32_8_ = (FeatureSet *)local_c8;
            local_a8._56_8_ = VVar2.obj;
            AddError(this,element_name_03,&pVVar11->super_Message,NAME,make_error_02);
          }
          lVar19 = lVar19 + 1;
        } while (lVar19 < result->value_count_);
      }
      absl::lts_20250127::container_internal::
      raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      ::destructor_impl((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                         *)local_a8);
      return;
    }
  }
  BuildEnum();
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::~raw_hash_set((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                   *)local_a8);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

void DescriptorBuilder::BuildEnum(const EnumDescriptorProto& proto,
                                  const Descriptor* parent,
                                  EnumDescriptor* result,
                                  internal::FlatAllocator& alloc) {
  const absl::string_view scope =
      (parent == nullptr) ? file_->package() : parent->full_name();

  result->all_names_ = AllocateNameStrings(scope, proto.name(), proto, alloc);
  ValidateSymbolName(proto.name(), result->full_name(), proto);
  result->file_ = file_;
  result->containing_type_ = parent;
  result->is_placeholder_ = false;
  result->is_unqualified_placeholder_ = false;
  result->visibility_ = static_cast<uint8_t>(proto.visibility());

  if (proto.value_size() == 0) {
    // We cannot allow enums with no values because this would mean there
    // would be no valid default value for fields of this type.
    AddError(result->full_name(), proto, DescriptorPool::ErrorCollector::NAME,
             "Enums must contain at least one value.");
  }

  // Calculate the continuous sequence of the labels.
  // These can be fast-path'd during lookup and don't need to be added to the
  // tables.
  // We use uint16_t to save space for sequential_value_limit_, so stop before
  // overflowing it. Worst case, we are not taking full advantage on huge
  // enums, but it is unlikely.
  for (int i = 0;
       i < std::numeric_limits<uint16_t>::max() && i < proto.value_size() &&
       // We do the math in int64_t to avoid overflows.
       proto.value(i).number() ==
           static_cast<int64_t>(i) + proto.value(0).number();
       ++i) {
    result->sequential_value_limit_ = i;
  }

  BUILD_ARRAY(proto, result, value, BuildEnumValue, result);
  BUILD_ARRAY(proto, result, reserved_range, BuildReservedRange, result);

  // Copy reserved names.
  int reserved_name_count = proto.reserved_name_size();
  result->reserved_name_count_ = reserved_name_count;
  result->reserved_names_ =
      alloc.AllocateArray<const std::string*>(reserved_name_count);
  for (int i = 0; i < reserved_name_count; ++i) {
    result->reserved_names_[i] = alloc.AllocateStrings(proto.reserved_name(i));
  }

  // Copy options.
  AllocateOptions(proto, result, EnumDescriptorProto::kOptionsFieldNumber,
                  "google.protobuf.EnumOptions", alloc);

  AddSymbol(result->full_name(), parent, result->name(), proto, Symbol(result));

  for (int i = 0; i < proto.reserved_range_size(); i++) {
    const EnumDescriptorProto_EnumReservedRange& range1 =
        proto.reserved_range(i);
    for (int j = i + 1; j < proto.reserved_range_size(); j++) {
      const EnumDescriptorProto_EnumReservedRange& range2 =
          proto.reserved_range(j);
      if (range1.end() >= range2.start() && range2.end() >= range1.start()) {
        AddError(result->full_name(), proto.reserved_range(i),
                 DescriptorPool::ErrorCollector::NUMBER, [&] {
                   return absl::Substitute(
                       "Reserved range $0 to $1 overlaps with "
                       "already-defined range $2 to $3.",
                       range2.start(), range2.end(), range1.start(),
                       range1.end());
                 });
      }
    }
  }

  absl::flat_hash_set<absl::string_view> reserved_name_set;
  for (const std::string& name : proto.reserved_name()) {
    if (!reserved_name_set.insert(name).second) {
      AddError(name, proto, DescriptorPool::ErrorCollector::NAME, [&] {
        return absl::Substitute("Enum value \"$0\" is reserved multiple times.",
                                name);
      });
    }
  }

  for (int i = 0; i < result->value_count(); i++) {
    const EnumValueDescriptor* value = result->value(i);
    for (int j = 0; j < result->reserved_range_count(); j++) {
      const EnumDescriptor::ReservedRange* range = result->reserved_range(j);
      if (range->start <= value->number() && value->number() <= range->end) {
        AddError(value->full_name(), proto.reserved_range(j),
                 DescriptorPool::ErrorCollector::NUMBER, [&] {
                   return absl::Substitute(
                       "Enum value \"$0\" uses reserved number $1.",
                       value->name(), value->number());
                 });
      }
    }
    if (reserved_name_set.contains(value->name())) {
      AddError(value->full_name(), proto.value(i),
               DescriptorPool::ErrorCollector::NAME, [&] {
                 return absl::Substitute("Enum value \"$0\" is reserved.",
                                         value->name());
               });
    }
  }
}